

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::unique_array<mpt::point<double>_>::resize(unique_array<mpt::point<double>_> *this,long len)

{
  bool bVar1;
  content<mpt::point<double>_> *this_00;
  content<mpt::point<double>_> *d;
  long len_local;
  unique_array<mpt::point<double>_> *this_local;
  
  bVar1 = reserve(this,len);
  if (bVar1) {
    if ((-1 < len) &&
       (this_00 = reference<mpt::content<mpt::point<double>_>_>::instance(&this->_ref),
       this_00 != (content<mpt::point<double>_> *)0x0)) {
      bVar1 = content<mpt::point<double>_>::set_length(this_00,len);
      return bVar1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool resize(long len)
	{
		if (!reserve(len)) {
			return false;
		}
		content<T> *d;
		if (len >= 0 && (d = _ref.instance())) {
			return d->set_length(len);
		}
		return true;
	}